

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

complex<double> __thiscall
TPZMatrix<std::complex<double>_>::ConditionNumber
          (TPZMatrix<std::complex<double>_> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  TPZMatrix<std::complex<double>_> *in_RDI;
  complex<double> cVar3;
  complex<double> invnorm;
  complex<double> thisnorm;
  TPZFMatrix<std::complex<double>_> Inv;
  REAL localtol;
  int64_t localnumiter;
  undefined4 in_stack_00000138;
  int in_stack_0000014c;
  TPZMatrix<std::complex<double>_> *in_stack_00000150;
  complex<double> *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffed8;
  DecomposeType dec;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  complex<double> local_10;
  
  dec = (DecomposeType)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            ((TPZFMatrix<std::complex<double>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  MatrixNorm(in_stack_00000150,in_stack_0000014c,(int64_t)this,(REAL)CONCAT44(p,in_stack_00000138));
  iVar1 = Inverse(in_RDI,(TPZFMatrix<std::complex<double>_> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),dec);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TVar TPZMatrix<std::complex<double>>::ConditionNumber(int, int64_t, REAL) [TVar = std::complex<double>]"
                            );
    poVar2 = std::operator<<(poVar2," - it was not possible to compute the inverse matrix.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::complex<double>::complex(&local_10,0.0,0.0);
  }
  else {
    MatrixNorm(in_stack_00000150,in_stack_0000014c,(int64_t)this,(REAL)CONCAT44(p,in_stack_00000138)
              );
    std::operator*(in_stack_fffffffffffffea8,(complex<double> *)0x12b2806);
  }
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x12b2847);
  cVar3._M_value._8_8_ = extraout_RDX;
  cVar3._M_value._0_8_ = extraout_RAX;
  return (complex<double>)cVar3._M_value;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}